

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O2

void * lj_alloc_realloc(void *msp,void *ptr,size_t nsize)

{
  byte *pbVar1;
  void *pvVar2;
  size_t newtopsize;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  mstate m;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  
  if (nsize < 0xffffffffffffff80) {
    puVar8 = (ulong *)((long)ptr + -0x10);
    uVar5 = *(ulong *)((long)ptr + -8);
    uVar6 = uVar5 & 0xfffffffffffffffc;
    uVar7 = 0x20;
    if (0x16 < nsize) {
      uVar7 = nsize + 0xf & 0xfffffffffffffff8;
    }
    if (((uVar5 & 1) == 0) && ((*puVar8 & 1) != 0)) {
      if (uVar7 < 0x100) {
LAB_0014ea2a:
        pvVar2 = lj_alloc_malloc(msp,nsize);
        if (pvVar2 != (void *)0x0) {
          if ((*(byte *)((long)ptr + -8) & 1) == 0) {
            uVar5 = (ulong)((*(byte *)puVar8 & 1) == 0) << 3 | 0xfffffffffffffff0;
          }
          else {
            uVar5 = 0xfffffffffffffff8;
          }
          uVar7 = uVar5 + uVar6;
          if (nsize <= uVar5 + uVar6) {
            uVar7 = nsize;
          }
          memcpy(pvVar2,ptr,uVar7);
          lj_alloc_free(msp,ptr);
          return pvVar2;
        }
        goto LAB_0014e958;
      }
      if (uVar6 < uVar7 + 8 || 0x10000 < uVar6 - uVar7) {
        uVar5 = *puVar8 & 0xfffffffffffffffe;
        uVar7 = uVar7 + 0x1036 & 0xfffffffffffff000;
        pvVar2 = CALL_MREMAP_((void *)((long)puVar8 - uVar5),uVar5 + uVar6 + 0x20,uVar7,1);
        if (pvVar2 == (void *)0xffffffffffffffff) goto LAB_0014ea2a;
        puVar8 = (ulong *)((long)pvVar2 + uVar5);
        *(ulong *)((long)pvVar2 + uVar5 + 8) = (uVar7 - uVar5) - 0x20 | 2;
        pbVar1 = (byte *)((uVar7 - uVar5) + -0x18 + (long)puVar8);
        pbVar1[0] = 0xb;
        pbVar1[1] = 0;
        pbVar1[2] = 0;
        pbVar1[3] = 0;
        pbVar1[4] = 0;
        pbVar1[5] = 0;
        pbVar1[6] = 0;
        pbVar1[7] = 0;
        *(undefined8 *)((long)pvVar2 + (uVar7 - 0x10)) = 0;
      }
    }
    else {
      uVar5 = (ulong)((uint)uVar5 & 1);
      if (uVar6 < uVar7) {
        if (((long)ptr + (uVar6 - 0x10) != *(long *)((long)msp + 0x20)) ||
           (uVar3 = *(long *)((long)msp + 0x10) + uVar6, uVar4 = uVar3 - uVar7,
           uVar3 < uVar7 || uVar4 == 0)) goto LAB_0014ea2a;
        *(ulong *)((long)ptr + -8) = uVar5 + uVar7 + 2;
        *(ulong *)((long)ptr + (uVar7 - 8)) = uVar4 | 1;
        *(byte **)((long)msp + 0x20) = (byte *)(uVar7 + (long)puVar8);
        *(ulong *)((long)msp + 0x10) = uVar4;
      }
      else if (0x1f < uVar6 - uVar7) {
        *(ulong *)((long)ptr + -8) = uVar5 + uVar7 + 2;
        *(ulong *)((long)ptr + (uVar7 - 8)) = uVar6 - uVar7 | 3;
        pbVar1 = (byte *)((long)ptr + (uVar6 - 8));
        *pbVar1 = *pbVar1 | 1;
        lj_alloc_free(msp,(byte *)((long)puVar8 + uVar7 + 0x10));
      }
    }
    puVar8 = puVar8 + 2;
  }
  else {
LAB_0014e958:
    puVar8 = (ulong *)0x0;
  }
  return puVar8;
}

Assistant:

static LJ_NOINLINE void *lj_alloc_realloc(void *msp, void *ptr, size_t nsize)
{
  if (nsize >= MAX_REQUEST) {
    return NULL;
  } else {
    mstate m = (mstate)msp;
    mchunkptr oldp = mem2chunk(ptr);
    size_t oldsize = chunksize(oldp);
    mchunkptr next = chunk_plus_offset(oldp, oldsize);
    mchunkptr newp = 0;
    size_t nb = request2size(nsize);

    /* Try to either shrink or extend into top. Else malloc-copy-free */
    if (is_direct(oldp)) {
      newp = direct_resize(oldp, nb);  /* this may return NULL. */
    } else if (oldsize >= nb) { /* already big enough */
      size_t rsize = oldsize - nb;
      newp = oldp;
      if (rsize >= MIN_CHUNK_SIZE) {
	mchunkptr rem = chunk_plus_offset(newp, nb);
	set_inuse(m, newp, nb);
	set_inuse(m, rem, rsize);
	lj_alloc_free(m, chunk2mem(rem));
      }
    } else if (next == m->top && oldsize + m->topsize > nb) {
      /* Expand into top */
      size_t newsize = oldsize + m->topsize;
      size_t newtopsize = newsize - nb;
      mchunkptr newtop = chunk_plus_offset(oldp, nb);
      set_inuse(m, oldp, nb);
      newtop->head = newtopsize |PINUSE_BIT;
      m->top = newtop;
      m->topsize = newtopsize;
      newp = oldp;
    }

    if (newp != 0) {
      return chunk2mem(newp);
    } else {
      void *newmem = lj_alloc_malloc(m, nsize);
      if (newmem != 0) {
	size_t oc = oldsize - overhead_for(oldp);
	memcpy(newmem, ptr, oc < nsize ? oc : nsize);
	lj_alloc_free(m, ptr);
      }
      return newmem;
    }
  }
}